

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

size_t ggml_nbytes(ggml_tensor *tensor)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = 2;
  do {
    if (lVar4 == 6) {
      uVar2 = (ulong)tensor->type;
      if ((0x5f000003UL >> (uVar2 & 0x3f) & 1) == 0) {
        sVar3 = (tensor->nb[0] * tensor->ne[0]) / (ulong)type_traits[uVar2].blck_size;
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          sVar3 = sVar3 + (tensor->ne[lVar4 + 1] + -1) * tensor->nb[lVar4 + 1];
        }
      }
      else {
        sVar3 = type_traits[uVar2].type_size;
        for (lVar4 = -0x20; lVar4 != 0; lVar4 = lVar4 + 8) {
          sVar3 = sVar3 + (*(long *)((long)tensor->nb + lVar4) + -1) *
                          *(long *)((long)tensor->op_params + lVar4 + -4);
        }
      }
      return sVar3;
    }
    lVar1 = lVar4 + -2;
    lVar4 = lVar4 + 1;
  } while (0 < tensor->ne[lVar1]);
  return 0;
}

Assistant:

size_t ggml_nbytes(const struct ggml_tensor * tensor) {
    for (int i = 0; i < GGML_MAX_DIMS; ++i) {
        if (tensor->ne[i] <= 0) {
            return 0;
        }
    }

    size_t nbytes;
    const size_t blck_size = ggml_blck_size(tensor->type);
    if (blck_size == 1) {
        nbytes = ggml_type_size(tensor->type);
        for (int i = 0; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }
    else {
        nbytes = tensor->ne[0]*tensor->nb[0]/blck_size;
        for (int i = 1; i < GGML_MAX_DIMS; ++i) {
            nbytes += (tensor->ne[i] - 1)*tensor->nb[i];
        }
    }

    return nbytes;
}